

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall ON_Extrusion::GetSpanVector(ON_Extrusion *this,int dir,double *span_vector)

{
  int iVar1;
  double dVar2;
  int path_dir;
  double *span_vector_local;
  int dir_local;
  ON_Extrusion *this_local;
  
  if (span_vector != (double *)0x0) {
    iVar1 = PathParameter(this);
    if (iVar1 == dir) {
      dVar2 = ON_Interval::operator[](&this->m_path_domain,0);
      *span_vector = dVar2;
      dVar2 = ON_Interval::operator[](&this->m_path_domain,1);
      span_vector[1] = dVar2;
      return true;
    }
    if ((1 - iVar1 == dir) && (this->m_profile != (ON_Curve *)0x0)) {
      iVar1 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])
                        (this->m_profile,span_vector);
      return (bool)((byte)iVar1 & 1);
    }
  }
  return false;
}

Assistant:

bool ON_Extrusion::GetSpanVector( // span "knots" 
      int dir, // 0 gets first parameter's domain, 1 gets second parameter's domain
      double* span_vector // array of length SpanCount() + 1 
      ) const  // 
{
  if ( span_vector )
  {
    const int path_dir = PathParameter();
    if ( path_dir == dir )
    {
      span_vector[0] = m_path_domain[0];
      span_vector[1] = m_path_domain[1];
      return true;
    }
    if ( 1-path_dir == dir && m_profile )
    {
      return m_profile->GetSpanVector(span_vector);
    }
  }
  return false;
}